

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_pose.h
# Opt level: O2

void __thiscall sfm::CameraPose::fill_p_matrix(CameraPose *this,Matrix<double,_3,_4> *P)

{
  long lVar1;
  double *pdVar2;
  byte bVar3;
  double local_e8 [12];
  undefined1 local_88 [8];
  Matrix<double,_3,_3> KR;
  
  bVar3 = 0;
  math::Matrix<double,_3,_3>::mult<3>((Matrix<double,_3,_3> *)local_88,&this->K,&this->R);
  math::Matrix<double,_3,_3>::mult((Vector<double,_3> *)(KR.m + 8),&this->K,&this->t);
  math::Matrix<double,_3,_3>::hstack<1>
            ((Matrix<double,_3,_3> *)local_88,(Matrix<double,_3,_1> *)(KR.m + 8));
  pdVar2 = local_e8;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    P->m[0] = *pdVar2;
    pdVar2 = pdVar2 + (ulong)bVar3 * -2 + 1;
    P = (Matrix<double,_3,_4> *)((long)P + ((ulong)bVar3 * -2 + 1) * 8);
  }
  return;
}

Assistant:

inline void
CameraPose::fill_p_matrix (math::Matrix<double, 3, 4>* P) const
{
    math::Matrix<double, 3, 3> KR = this->K * this->R;
    math::Matrix<double, 3, 1> Kt(*(this->K * this->t));
    *P = KR.hstack(Kt);
}